

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O3

bool __thiscall Assimp::ASEImporter::GenerateNormals(ASEImporter *this,Mesh *mesh)

{
  pointer paVar1;
  pointer paVar2;
  
  paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar1 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((paVar2 != paVar1) && (this->configRecomputeNormals == false)) {
    do {
      if (paVar2->x != 0.0) {
        return true;
      }
      if (NAN(paVar2->x)) {
        return true;
      }
      if (paVar2->y != 0.0) {
        return true;
      }
      if (NAN(paVar2->y)) {
        return true;
      }
      if (paVar2->z != 0.0) {
        return true;
      }
      if (NAN(paVar2->z)) {
        return true;
      }
      paVar2 = paVar2 + 1;
    } while (paVar2 != paVar1);
  }
  ComputeNormalsWithSmoothingsGroups<Assimp::ASE::Face>
            (&mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>);
  return false;
}

Assistant:

bool ASEImporter::GenerateNormals(ASE::Mesh& mesh)  {

    if (!mesh.mNormals.empty() && !configRecomputeNormals)
    {
        // Check whether there are only uninitialized normals. If there are
        // some, skip all normals from the file and compute them on our own
        for (std::vector<aiVector3D>::const_iterator qq =  mesh.mNormals.begin();qq != mesh.mNormals.end();++qq) {
            if ((*qq).x || (*qq).y || (*qq).z)
            {
                return true;
            }
        }
    }
    // The array is reused.
    ComputeNormalsWithSmoothingsGroups<ASE::Face>(mesh);
    return false;
}